

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Areal_Object_State_PDU::Encode(Areal_Object_State_PDU *this,KDataStream *stream)

{
  pointer pWVar1;
  pointer pWVar2;
  
  Object_State_Header::Encode(&this->super_Object_State_Header,stream);
  KDataStream::Write(stream,(this->super_Object_State_Header).field_0x4b);
  (*(this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_ObjTyp,stream);
  (*(this->m_Apperance).super_ObjectAppearance.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_Apperance,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumPoints);
  (*(this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_ReqID,stream);
  (*(this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_RecvID,stream);
  pWVar1 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pWVar2 = (this->m_vPoints).
                super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
                ._M_impl.super__Vector_impl_data._M_start; pWVar2 != pWVar1; pWVar2 = pWVar2 + 1) {
    (*(pWVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pWVar2,stream);
  }
  return;
}

Assistant:

void Areal_Object_State_PDU::Encode( KDataStream & stream ) const
{
    Object_State_Header::Encode( stream );

    stream << m_ModificationUnion.m_ui8Modifications
           << KDIS_STREAM m_ObjTyp
           << KDIS_STREAM m_Apperance
           << m_ui16NumPoints
           << KDIS_STREAM m_ReqID
           << KDIS_STREAM m_RecvID;

    vector<WorldCoordinates>::const_iterator citr = m_vPoints.begin();
    vector<WorldCoordinates>::const_iterator citrEnd = m_vPoints.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}